

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O2

void __thiscall QEvdevTouchScreenData::assignIds(QEvdevTouchScreenData *this)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uchar *args;
  QEvdevTouchScreenHandler *pQVar10;
  QEvdevTouchScreenData *pQVar11;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  const_iterator it;
  int dist;
  int bestId;
  undefined1 local_68 [24];
  QHash<int,_QEvdevTouchScreenData::Contact> local_50;
  undefined1 local_48 [8];
  QHash<int,_QEvdevTouchScreenData::Contact> local_40;
  TouchPoint *local_38;
  
  local_38 = *(TouchPoint **)(in_FS_OFFSET + 0x28);
  local_40.d = (this->m_lastContacts).d;
  if ((local_40.d != (Data *)0x0) &&
     (((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = (undefined1  [8])(this->m_contacts).d;
  if ((local_48 != (undefined1  [8])0x0) &&
     ((((RefCount *)&((QEvdevTouchScreenHandler *)local_48)->super_QObject)->atomic)._q_value.
      super___atomic_base<int>._M_i != -1)) {
    LOCK();
    (((RefCount *)&((QEvdevTouchScreenHandler *)local_48)->super_QObject)->atomic)._q_value.
    super___atomic_base<int>._M_i =
         (((RefCount *)&((QEvdevTouchScreenHandler *)local_48)->super_QObject)->atomic)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.d = (Data *)0x0;
  local_68._0_16_ = ZEXT816(0);
  pQVar10 = (QEvdevTouchScreenHandler *)0x0;
  uVar7 = 0;
  iVar13 = -1;
  while ((local_48 != (undefined1  [8])0x0 && (*(size_t *)((long)local_48 + 8) != 0))) {
    if (local_40.d == (Data *)0x0) goto LAB_00125fcb;
    if ((local_40.d)->size == 0) goto LAB_00125f73;
    bestId = 0;
    pQVar11 = (QEvdevTouchScreenData *)local_48;
    local_68._0_16_ =
         (undefined1  [16])
         QHash<int,_QEvdevTouchScreenData::Contact>::begin
                   ((QHash<int,_QEvdevTouchScreenData::Contact> *)pQVar11);
    iVar12 = -1;
    while( true ) {
      if (local_68._0_8_ == (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)0x0 &&
          local_68._8_8_ == 0) break;
      dist = -0x55555556;
      pSVar2 = (local_68._0_8_)->spans;
      uVar6 = local_68._8_8_ >> 7;
      pEVar3 = pSVar2[uVar6].entries;
      bVar1 = pSVar2[uVar6].offsets[local_68._8_4_ & 0x7f];
      iVar5 = findClosestContact(pQVar11,&local_40,*(int *)(pEVar3[bVar1].storage.data + 8),
                                 *(int *)(pEVar3[bVar1].storage.data + 0xc),&dist);
      if ((-1 < iVar5) && (dist < iVar12 || iVar12 == -1)) {
        uVar7 = local_68._8_8_;
        pQVar10 = (QEvdevTouchScreenHandler *)local_68._0_8_;
        bestId = iVar5;
        iVar12 = dist;
      }
      pQVar11 = (QEvdevTouchScreenData *)local_68;
      QHashPrivate::iterator<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::operator++
                ((iterator<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)local_68);
    }
    if (-1 < iVar12) {
      pQVar11 = pQVar10->d;
      lVar9 = (uVar7 >> 7) * 0x90;
      uVar6 = (ulong)((uint)uVar7 & 0x7f);
      lVar4 = *(long *)((long)&pQVar11->m_rotate + lVar9 + -0x50);
      *(int *)(lVar4 + (ulong)*(uchar *)((long)&pQVar11->q + uVar6 + lVar9) * 0x1c + 4) = bestId;
      QHash<int,QEvdevTouchScreenData::Contact>::emplace<QEvdevTouchScreenData::Contact_const&>
                ((QHash<int,QEvdevTouchScreenData::Contact> *)&local_50,&bestId,
                 (Contact *)
                 (lVar4 + (ulong)*(uchar *)((long)&pQVar11->q + uVar6 + lVar9) * 0x1c + 4));
      QHash<int,_QEvdevTouchScreenData::Contact>::removeImpl<int>(&local_40,&bestId);
      it.i.bucket = uVar7;
      it.i.d = (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)pQVar10;
      QHash<int,_QEvdevTouchScreenData::Contact>::erase
                ((QHash<int,_QEvdevTouchScreenData::Contact> *)local_48,it);
      if (iVar13 < bestId) {
        iVar13 = bestId;
      }
    }
  }
  if (local_40.d != (Data *)0x0) {
LAB_00125f73:
    if ((local_40.d)->size != 0) goto LAB_00125f7a;
  }
LAB_00125fcb:
  local_68._0_16_ =
       (undefined1  [16])
       QHash<int,_QEvdevTouchScreenData::Contact>::begin
                 ((QHash<int,_QEvdevTouchScreenData::Contact> *)local_48);
  while( true ) {
    iVar13 = iVar13 + 1;
    if (local_68._0_8_ == (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)0x0 &&
        local_68._8_8_ == 0) break;
    pSVar2 = (local_68._0_8_)->spans;
    uVar7 = local_68._8_8_ >> 7;
    uVar8 = local_68._8_4_ & 0x7f;
    pEVar3 = pSVar2[uVar7].entries;
    *(int *)(pEVar3[pSVar2[uVar7].offsets[uVar8]].storage.data + 4) = iVar13;
    args = pEVar3[pSVar2[uVar7].offsets[uVar8]].storage.data + 4;
    QHash<int,QEvdevTouchScreenData::Contact>::emplace<QEvdevTouchScreenData::Contact_const&>
              ((QHash<int,QEvdevTouchScreenData::Contact> *)&local_50,(int *)args,(Contact *)args);
    QHashPrivate::iterator<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::operator++
              ((iterator<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)local_68);
  }
LAB_00125f7a:
  QHash<int,_QEvdevTouchScreenData::Contact>::operator=(&this->m_contacts,&local_50);
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash(&local_50);
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)local_48);
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash(&local_40);
  if (*(TouchPoint **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevTouchScreenData::assignIds()
{
    QHash<int, Contact> candidates = m_lastContacts, pending = m_contacts, newContacts;
    int maxId = -1;
    QHash<int, Contact>::iterator it, ite, bestMatch;
    while (!pending.isEmpty() && !candidates.isEmpty()) {
        int bestDist = -1, bestId = 0;
        for (it = pending.begin(), ite = pending.end(); it != ite; ++it) {
            int dist;
            int id = findClosestContact(candidates, it->x, it->y, &dist);
            if (id >= 0 && (bestDist == -1 || dist < bestDist)) {
                bestDist = dist;
                bestId = id;
                bestMatch = it;
            }
        }
        if (bestDist >= 0) {
            bestMatch->trackingId = bestId;
            newContacts.insert(bestId, *bestMatch);
            candidates.remove(bestId);
            pending.erase(bestMatch);
            if (bestId > maxId)
                maxId = bestId;
        }
    }
    if (candidates.isEmpty()) {
        for (it = pending.begin(), ite = pending.end(); it != ite; ++it) {
            it->trackingId = ++maxId;
            newContacts.insert(it->trackingId, *it);
        }
    }
    m_contacts = newContacts;
}